

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.cpp
# Opt level: O3

void updatePred(Graph *G,int *v,vector<bool,_std::allocator<bool>_> *in_R,
               vector<bool,_std::allocator<bool>_> *reached_from_node_in_U,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *pred)

{
  ulong *puVar1;
  int iVar2;
  pointer psVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  pointer psVar8;
  pointer psVar9;
  AdjList *g;
  int local_4c;
  int *local_48;
  pointer local_40;
  Graph *local_38;
  
  iVar2 = *v;
  uVar6 = (ulong)iVar2;
  iVar4 = iVar2 + 0x3f;
  if (-1 < (long)uVar6) {
    iVar4 = iVar2;
  }
  puVar1 = (reached_from_node_in_U->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           (long)(iVar4 >> 6) +
           (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
  psVar3 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar8 = *(pointer *)
            &psVar3[uVar6].super_StoredVertex.m_out_edges.
             super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
  ;
  psVar9 = *(pointer *)
            ((long)&psVar3[uVar6].super_StoredVertex.m_out_edges.
                    super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
            + 8);
  local_48 = v;
  local_40 = psVar9;
  local_38 = G;
  if (psVar8 != psVar9) {
    do {
      uVar6 = (psVar8->super_stored_edge<unsigned_long>).m_target;
      uVar5 = uVar6 + 0x3f;
      if (-1 < (long)uVar6) {
        uVar5 = uVar6;
      }
      uVar7 = (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001);
      if (((reached_from_node_in_U->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar5 >> 6) + uVar7 + 0xffffffffffffffff] >> (uVar6 & 0x3f) & 1) == 0) {
        if (((in_R->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[((long)uVar5 >> 6) + uVar7 + 0xffffffffffffffff]
            & 1L << ((byte)uVar6 & 0x3f)) != 0) {
          (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar6] = (long)*local_48;
        }
        local_4c = (int)uVar6;
        updatePred(local_38,&local_4c,in_R,reached_from_node_in_U,pred);
        psVar9 = local_40;
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar9);
  }
  return;
}

Assistant:

inline void updatePred(const Graph& G, const int& v,
    std::vector<bool>& in_R,
    std::vector<bool>& reached_from_node_in_U,
    std::vector<unsigned long>& pred)
{ 
    reached_from_node_in_U[v] = true;
    OutEdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = out_edges(v, G); ei != ei_end; ++ei){
        unsigned long w = target(*ei, G);
        if (!reached_from_node_in_U[w]) { 
            if ( in_R[w] ) pred[w] = v;
            updatePred(G, w, in_R, reached_from_node_in_U, pred);
        }
    }
}